

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_adios_mpi.cpp
# Opt level: O2

adios2_adios * adios2_init_config_glue_mpi(char *config_file,MPI_Comm comm,char *host_language)

{
  ADIOS *pAVar1;
  allocator local_a9;
  ompi_communicator_t local_a8 [8];
  allocator local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&local_40,"for config_file, in call to adios2_init or adios2_init_config",
             local_a0);
  adios2::helper::CheckForNullptr<char_const>(config_file,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pAVar1 = (ADIOS *)operator_new(0x580);
  std::__cxx11::string::string(local_60,config_file,local_a0);
  adios2::helper::CommDupMPI(local_a8);
  std::__cxx11::string::string(local_80,host_language,&local_a9);
  adios2::core::ADIOS::ADIOS(pAVar1,local_60,local_a8,local_80);
  std::__cxx11::string::~string(local_80);
  adios2::helper::Comm::~Comm((Comm *)local_a8);
  std::__cxx11::string::~string(local_60);
  return (adios2_adios *)pAVar1;
}

Assistant:

adios2_adios *adios2_init_config_glue_mpi(const char *config_file, MPI_Comm comm,
                                          const char *host_language)
{
    adios2_adios *adios = nullptr;

    try
    {
        adios2::helper::CheckForNullptr(
            config_file, "for config_file, in call to adios2_init or adios2_init_config");
        adios = reinterpret_cast<adios2_adios *>(
            new adios2::core::ADIOS(config_file, adios2::helper::CommDupMPI(comm), host_language));
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_init or adios2_init_config");
    }
    return adios;
}